

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Expression * __thiscall
EOPlus::Parser::ParseExpression(Expression *__return_storage_ptr__,Parser *this)

{
  deque<util::variant,_std::allocator<util::variant>_> *this_00;
  int iVar1;
  Parser_Token_Server_Base *pPVar2;
  Expression *pEVar3;
  bool bVar4;
  int iVar5;
  Parser_Error *pPVar6;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  Token *t_03;
  allocator<char> local_3a1;
  Expression *local_3a0;
  string local_398;
  string local_378;
  undefined1 local_358 [64];
  Token tt;
  string local_2c8;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  Token t;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [64];
  Token local_170;
  Token local_120;
  Token local_d0;
  Token local_80;
  
  local_3a0 = __return_storage_ptr__;
  Expression::Expression(__return_storage_ptr__);
  util::variant::variant((variant *)local_1b0);
  Token::Token(&t,Invalid,(variant *)local_1b0);
  std::__cxx11::string::~string((string *)(local_1b0 + 0x10));
  bVar4 = GetToken(this,&t,1);
  if (bVar4) {
    util::variant::GetString_abi_cxx11_((string *)&tt,&t.data);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tt
                            ,"goto");
    std::__cxx11::string::~string((string *)&tt);
    pEVar3 = local_3a0;
    if (bVar4) {
      util::variant::variant((variant *)local_1f0);
      Token::Token(&tt,Invalid,(variant *)local_1f0);
      std::__cxx11::string::~string((string *)(local_1f0 + 0x10));
      bVar4 = GetToken(this,&tt,1);
      if (!bVar4) {
        pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"Expected identifier after \'goto\'.",&local_3a1);
        std::operator+(&local_398,&local_378," Got: ");
        Token::Token(&local_80,
                     &((this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                      _M_head_impl)->reject_token);
        token_got_string_abi_cxx11_(&local_2c8,(EOPlus *)&local_80,t_02);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,&local_398,&local_2c8);
        pPVar2 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar5 = pPVar2->line;
        iVar1 = pPVar2->reject_line;
        if (iVar1 < iVar5) {
          iVar1 = iVar5;
        }
        Parser_Error::Parser_Error(pPVar6,(string *)local_358,iVar1);
        __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)&pEVar3->function);
      util::variant::GetString_abi_cxx11_(&local_398,&tt.data);
      util::variant::variant((variant *)local_358,&local_398);
      std::deque<util::variant,std::allocator<util::variant>>::_M_assign_aux<util::variant_const*>
                ((deque<util::variant,std::allocator<util::variant>> *)&pEVar3->args,local_358,&tt);
      std::__cxx11::string::~string((string *)(local_358 + 0x10));
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&tt.data.val_string);
    }
    else {
      ParseScopes((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&tt,this);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_M_move_assign1
                (&pEVar3->scopes,&tt);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&tt);
      util::variant::GetString_abi_cxx11_((string *)&tt,&t.data);
      std::__cxx11::string::operator=((string *)&pEVar3->function,(string *)&tt);
      std::__cxx11::string::~string((string *)&tt);
      local_218._M_unused._M_object = (void *)0x0;
      local_218._8_8_ = 0;
      local_200 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:227:29)>
                  ::_M_invoke;
      local_208 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:227:29)>
                  ::_M_manager;
      bVar4 = GetTokenIf(this,&t,(function<bool_(const_EOPlus::Token_&)> *)&local_218,0x20);
      std::_Function_base::~_Function_base((_Function_base *)&local_218);
      if (!bVar4) {
        pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"Expected \'(\' after function-name.",
                   (allocator<char> *)&local_2c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,&local_398," Got: ");
        Token::Token(&local_170,
                     &((this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                      _M_head_impl)->reject_token);
        token_got_string_abi_cxx11_(&local_378,(EOPlus *)&local_170,t_03);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,&local_378);
        pPVar2 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar5 = pPVar2->line;
        iVar1 = pPVar2->reject_line;
        if (iVar1 < iVar5) {
          iVar1 = iVar5;
        }
        Parser_Error::Parser_Error(pPVar6,(string *)&tt,iVar1);
        __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_238._M_unused._M_object = (void *)0x0;
      local_238._8_8_ = 0;
      local_220 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:229:30)>
                  ::_M_invoke;
      local_228 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:229:30)>
                  ::_M_manager;
      bVar4 = GetTokenIf(this,&t,(function<bool_(const_EOPlus::Token_&)> *)&local_238,0x20);
      std::_Function_base::~_Function_base((_Function_base *)&local_238);
      if (!bVar4) {
        this_00 = &local_3a0->args;
        do {
          bVar4 = GetToken(this,&t,0xe);
          if (!bVar4) {
            pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,"Expected function-argument in function-argument-list.",
                       (allocator<char> *)&local_2c8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,&local_398," Got: ");
            Token::Token(&local_120,
                         &((this->tok)._M_t.
                           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                          _M_head_impl)->reject_token);
            token_got_string_abi_cxx11_(&local_378,(EOPlus *)&local_120,t_01);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tt,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,&local_378);
            pPVar2 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar5 = pPVar2->line;
            iVar1 = pPVar2->reject_line;
            if (iVar1 < iVar5) {
              iVar1 = iVar5;
            }
            Parser_Error::Parser_Error(pPVar6,(string *)&tt,iVar1);
            __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::deque<util::variant,_std::allocator<util::variant>_>::push_back(this_00,&t.data);
          local_2a8._M_unused._M_object = (void *)0x0;
          local_2a8._8_8_ = 0;
          local_290 = std::
                      _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:238:31)>
                      ::_M_invoke;
          local_298 = std::
                      _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:238:31)>
                      ::_M_manager;
          bVar4 = GetTokenIf(this,&t,(function<bool_(const_EOPlus::Token_&)> *)&local_2a8,0x60);
          std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
          if (!bVar4) {
            pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,
                       "Expected \',\' or \')\' after function-argument in function-argument-list.",
                       (allocator<char> *)&local_2c8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,&local_398," Got: ");
            Token::Token(&local_d0,
                         &((this->tok)._M_t.
                           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                          _M_head_impl)->reject_token);
            token_got_string_abi_cxx11_(&local_378,(EOPlus *)&local_d0,t_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tt,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,&local_378);
            pPVar2 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar5 = pPVar2->line;
            iVar1 = pPVar2->reject_line;
            if (iVar1 < iVar5) {
              iVar1 = iVar5;
            }
            Parser_Error::Parser_Error(pPVar6,(string *)&tt,iVar1);
            __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar5 = util::variant::GetInt(&t.data);
        } while (iVar5 != 9);
      }
    }
  }
  std::__cxx11::string::~string((string *)&t.data.val_string);
  return local_3a0;
}

Assistant:

Expression Parser::ParseExpression()
	{
		Expression expression;
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			if (std::string(t.data) == "goto")
			{
				Token tt;

				if (this->GetToken(tt, Token::Identifier))
				{
					expression.function = "setstate";
					expression.args = {std::string(tt.data)};
				}
				else
				{
					PARSER_ERROR_GOT("Expected identifier after 'goto'.");
				}
			}
			else
			{
				expression.scopes = this->ParseScopes();
				expression.function = std::string(t.data);

				if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1('('); }, Token::Operator))
				{
					if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1(')'); }, Token::Operator))
					{
						return expression;
					}

					while (this->GetToken(t, Token::String | Token::Float | Token::Integer))
					{
						expression.args.push_back(t.data);

						if (this->GetTokenIf(t, [](const Token& t)
						{
							return ((t.type == Token::Symbol && std::string(t.data) == ",")
							     || (t.type == Token::Operator && int(t.data) == UOP1(')')));
						}, Token::Symbol | Token::Operator))
						{
							if (int(t.data) == UOP1(')'))
								return expression;
						}
						else
						{
							PARSER_ERROR_GOT("Expected ',' or ')' after function-argument in function-argument-list.");
						}
					}

					PARSER_ERROR_GOT("Expected function-argument in function-argument-list.");
				}
				else
				{
					PARSER_ERROR_GOT("Expected '(' after function-name.");
				}
			}
		}

		return expression;
	}